

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::matrices_times_matrices_dim<1>(Omega_h *this,Reals *a,Reals *b)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  int size_in;
  size_t sVar3;
  Reals RVar4;
  allocator local_79;
  Write<double> out;
  Write<signed_char> local_68;
  type f;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  size_in = (int)(sVar3 >> 3);
  if ((int)(uVar2 >> 3) == size_in) {
    std::__cxx11::string::string((string *)&f,"",&local_79);
    Write<double>::Write(&out,size_in,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<double>::Write(&f.out,&out);
    Write<double>::Write(&f.a.write_,&a->write_);
    Write<double>::Write(&f.b.write_,&b->write_);
    parallel_for<Omega_h::matrices_times_matrices_dim<1>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (size_in,&f,"matrices_times_matrices");
    Write<double>::Write(&local_68,(Write<signed_char> *)&out);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_68);
    Write<double>::~Write((Write<double> *)&local_68);
    matrices_times_matrices_dim<1>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)&f);
    Write<double>::~Write(&out);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","b.size() == n * matrix_ncomps(dim, dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
       ,0x48);
}

Assistant:

Reals matrices_times_matrices_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), matrix_ncomps(dim, dim));
  OMEGA_H_CHECK(b.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * matrix_ncomps(dim, dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_matrix(out, i, get_matrix<dim, dim>(a, i) * get_matrix<dim, dim>(b, i));
  };
  parallel_for(n, f, "matrices_times_matrices");
  return out;
}